

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  char cVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  if (at == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                  ,0x2144,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  pbVar2 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8);
  if (at <= uVar3) {
    bVar5 = true;
    if (uVar3 != at) {
      cVar1 = *(char *)(*(long *)&pbVar2[this->m_stringIndex]._M_dataplus + at);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        isBoundary();
      }
      lVar4 = ::std::__cxx11::string::find('p',(ulong)(uint)(int)cVar1);
      if (lVar4 != -1) {
        cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                    _M_dataplus + -1 + at);
        if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
          isBoundary();
        }
        lVar4 = ::std::__cxx11::string::find('p',(ulong)(uint)(int)cVar1);
        if (lVar4 == -1) {
          return true;
        }
      }
      cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                  _M_dataplus + at);
      if (isBreakableBefore(char)::chars_abi_cxx11_ == '\0') {
        isBoundary();
      }
      lVar4 = ::std::__cxx11::string::find(' ',(ulong)(uint)(int)cVar1);
      if (lVar4 == -1) {
        cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                    _M_dataplus + -1 + at);
        if (isBreakableAfter(char)::chars_abi_cxx11_ == '\0') {
          isBoundary();
        }
        lVar4 = ::std::__cxx11::string::find('H',(ulong)(uint)(int)cVar1);
        bVar5 = lVar4 != -1;
      }
    }
    return bVar5;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                ,0x2145,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}